

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

bool __thiscall Assimp::D3MF::XmlSerializer::ReadToEndElement(XmlSerializer *this,string *closeTag)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  undefined4 extraout_var;
  Logger *this_00;
  byte unaff_BPL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar3 == '\0') {
      this_00 = DefaultLogger::get();
      std::operator+(&local_50,"unexpected EOF, expected closing <",closeTag);
      std::operator+(&local_70,&local_50,"> tag");
      Logger::error(this_00,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      unaff_BPL = 0;
      break;
    }
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string
              ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar3),(allocator *)&local_50);
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      unaff_BPL = 1;
LAB_00583b7d:
      bVar1 = false;
    }
    else {
      iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
      if ((iVar3 == 2) && (_Var2 = std::operator==(&local_70,closeTag), _Var2)) {
        unaff_BPL = 0;
        goto LAB_00583b7d;
      }
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&local_70);
  } while (bVar1);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ReadToEndElement(const std::string& closeTag) {
        while(xmlReader->read()) {
            const std::string &nodeName( xmlReader->getNodeName() );
            if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT) {
                return true;
            } else if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT_END && nodeName == closeTag) {
                return false;
            }
        }
        ASSIMP_LOG_ERROR("unexpected EOF, expected closing <" + closeTag + "> tag");

        return false;
    }